

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayout.cpp
# Opt level: O3

void __thiscall
QGridLayoutPrivate::setupLayoutData(QGridLayoutPrivate *this,int hSpacing,int vSpacing)

{
  QList<QLayoutStruct> *chain;
  QList<QLayoutStruct> *chain_00;
  int iVar1;
  int iVar2;
  QLayout *this_00;
  int *piVar3;
  int *piVar4;
  qsizetype qVar5;
  QGridBox *pQVar6;
  QLayoutStruct *pQVar7;
  byte bVar8;
  int iVar9;
  pointer pQVar10;
  ulong uVar11;
  undefined1 *__s;
  ulong uVar12;
  QGridBox **grid;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  bool bVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  size_t totalCapacity;
  long lVar17;
  ulong uVar18;
  uint uVar19;
  size_t totalCapacity_1;
  long lVar20;
  ulong uVar21;
  long in_FS_OFFSET;
  ulong local_2068;
  QGridBox *local_2050 [256];
  ulong local_1850;
  ulong local_1848;
  undefined1 *local_1840;
  undefined1 local_1838 [6144];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->field_0x194 & 4) == 0) goto LAB_002e6067;
  this_00 = *(QLayout **)&(this->super_QLayoutPrivate).field_0x8;
  this->field_0x194 = this->field_0x194 & 0xf7;
  if (0 < this->rr) {
    lVar20 = 2;
    lVar17 = 0;
    do {
      pQVar10 = QList<QLayoutStruct>::data(&this->rowData);
      piVar3 = (this->rStretch).d.ptr;
      piVar4 = (this->rMinHeights).d.ptr;
      iVar9 = piVar4[lVar17];
      *(int *)((long)pQVar10 + lVar20 * 4 + -8) = piVar3[lVar17];
      *(int *)((long)pQVar10 + lVar20 * 4 + -4) = iVar9;
      (&pQVar10->sizeHint)[lVar20] = iVar9;
      (&pQVar10->stretch)[lVar20] = 0x7ffff;
      *(undefined2 *)(&pQVar10->minimumSize + lVar20) = 0x100;
      (&pQVar10->maximumSize)[lVar20] = 0;
      iVar9 = 0x7ffff;
      if (piVar3[lVar17] == 0) {
        iVar9 = piVar4[lVar17];
      }
      pQVar10 = QList<QLayoutStruct>::data(&this->rowData);
      (&pQVar10->stretch)[lVar20] = iVar9;
      lVar17 = lVar17 + 1;
      lVar20 = lVar20 + 8;
    } while (lVar17 < this->rr);
  }
  iVar9 = this->cc;
  if (0 < iVar9) {
    lVar17 = 2;
    lVar20 = 0;
    do {
      pQVar10 = QList<QLayoutStruct>::data(&this->colData);
      piVar3 = (this->cStretch).d.ptr;
      piVar4 = (this->cMinWidths).d.ptr;
      iVar9 = piVar4[lVar20];
      *(int *)((long)pQVar10 + lVar17 * 4 + -8) = piVar3[lVar20];
      *(int *)((long)pQVar10 + lVar17 * 4 + -4) = iVar9;
      (&pQVar10->sizeHint)[lVar17] = iVar9;
      (&pQVar10->stretch)[lVar17] = 0x7ffff;
      *(undefined2 *)(&pQVar10->minimumSize + lVar17) = 0x100;
      (&pQVar10->maximumSize)[lVar17] = 0;
      iVar9 = 0x7ffff;
      if (piVar3[lVar20] == 0) {
        iVar9 = piVar4[lVar20];
      }
      pQVar10 = QList<QLayoutStruct>::data(&this->colData);
      (&pQVar10->stretch)[lVar17] = iVar9;
      lVar20 = lVar20 + 1;
      iVar9 = this->cc;
      lVar17 = lVar17 + 8;
    } while (lVar20 < iVar9);
  }
  qVar5 = (this->things).d.size;
  __s = local_1838;
  memset(__s,0xaa,0x1800);
  uVar19 = (uint)qVar5;
  uVar18 = (ulong)(int)uVar19;
  local_1850 = 0x100;
  local_1848 = 0;
  local_1840 = __s;
  if ((long)uVar18 < 0x101) {
    if (0 < (long)uVar18) goto LAB_002e5b6e;
  }
  else {
    uVar12 = uVar18 * 0x18;
    local_1850 = uVar18;
    uVar11 = QtPrivate::expectedAllocSize(uVar12,0x10);
    uVar21 = uVar18;
    if (uVar11 != 0) {
      uVar21 = uVar11 / 0x18;
      if (uVar11 < 0x18) {
        __s = (undefined1 *)0x0;
        local_1850 = uVar21;
        goto LAB_002e5b6e;
      }
      uVar12 = uVar21 * 0x18;
    }
    __s = (undefined1 *)malloc(uVar12);
    local_1850 = uVar21;
LAB_002e5b6e:
    local_1840 = __s;
    memset(__s,0xff,uVar18 * 0x18);
    iVar9 = this->cc;
  }
  grid = local_2050;
  local_1848 = uVar18;
  memset(grid,0xaa,0x800);
  uVar18 = (long)iVar9 * (long)this->rr;
  local_2068 = 0x100;
  if (0x100 < (int)uVar18) {
    uVar12 = uVar18 * 8;
    uVar21 = QtPrivate::expectedAllocSize(uVar12,0x10);
    local_2068 = uVar18;
    if (uVar21 != 0) {
      local_2068 = uVar21 >> 3;
      uVar12 = uVar21 & 0xfffffffffffffff8;
      if (uVar12 == 0) {
        grid = (QGridBox **)0x0;
        goto LAB_002e5c31;
      }
    }
    grid = (QGridBox **)malloc(uVar12);
  }
LAB_002e5c31:
  bVar8 = 0;
  memset(grid,0,uVar18 * 8);
  if (0 < (int)uVar19) {
    uVar18 = 0;
    bVar8 = 0;
    do {
      pQVar6 = (this->things).d.ptr[uVar18];
      iVar9 = (*pQVar6->item_->_vptr_QLayoutItem[3])();
      lVar17 = uVar18 * 0x18;
      *(ulong *)(local_1840 + lVar17) = CONCAT44(extraout_var,iVar9);
      iVar9 = (*pQVar6->item_->_vptr_QLayoutItem[2])();
      *(ulong *)(local_1840 + lVar17 + 8) = CONCAT44(extraout_var_00,iVar9);
      iVar9 = (*pQVar6->item_->_vptr_QLayoutItem[4])();
      *(ulong *)(local_1840 + lVar17 + 0x10) = CONCAT44(extraout_var_01,iVar9);
      iVar9 = (*pQVar6->item_->_vptr_QLayoutItem[9])();
      if ((char)iVar9 != '\0') {
        this->field_0x194 = this->field_0x194 | 8;
      }
      iVar9 = this->rr + -1;
      if (-1 < pQVar6->torow) {
        iVar9 = pQVar6->torow;
      }
      if (pQVar6->row == iVar9) {
        addData(this,pQVar6,(QGridLayoutSizeTriple *)(local_1840 + uVar18 * 0x18),true,false);
      }
      else {
        initEmptyMultiBox(&this->rowData,pQVar6->row,iVar9);
        bVar8 = 1;
      }
      iVar9 = this->cc + -1;
      if (-1 < pQVar6->tocol) {
        iVar9 = pQVar6->tocol;
      }
      if (pQVar6->col == iVar9) {
        addData(this,pQVar6,(QGridLayoutSizeTriple *)(local_1840 + uVar18 * 0x18),false,true);
      }
      else {
        initEmptyMultiBox(&this->colData,pQVar6->col,iVar9);
        bVar8 = 1;
      }
      lVar17 = (long)pQVar6->row;
      iVar9 = this->rr + -1;
      if (-1 < pQVar6->torow) {
        iVar9 = pQVar6->torow;
      }
      if (pQVar6->row <= iVar9) {
        iVar14 = this->cc;
        iVar2 = iVar14 + -1;
        if (-1 < pQVar6->tocol) {
          iVar2 = pQVar6->tocol;
        }
        iVar1 = pQVar6->col;
        lVar20 = lVar17 * iVar14 + (long)iVar1;
        do {
          lVar16 = lVar20;
          iVar15 = (iVar2 - iVar1) + 1;
          if (iVar1 <= iVar2) {
            do {
              grid[lVar16] = pQVar6;
              lVar16 = lVar16 + 1;
              iVar15 = iVar15 + -1;
            } while (iVar15 != 0);
          }
          lVar17 = lVar17 + 1;
          lVar20 = lVar20 + iVar14;
        } while (iVar9 + 1 != (int)lVar17);
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 != (uVar19 & 0x7fffffff));
  }
  chain = &this->colData;
  setupSpacings(this,chain,grid,hSpacing,Horizontal);
  chain_00 = &this->rowData;
  setupSpacings(this,chain_00,grid,vSpacing,Vertical);
  if (!(bool)(~bVar8 & 1 | (int)uVar19 < 1)) {
    lVar17 = 1;
    uVar18 = 0;
    do {
      pQVar6 = (this->things).d.ptr[uVar18];
      iVar9 = pQVar6->row;
      iVar14 = this->rr + -1;
      if (-1 < pQVar6->torow) {
        iVar14 = pQVar6->torow;
      }
      if (iVar9 != iVar14) {
        iVar2 = *(int *)(local_1840 + lVar17 * 8 + -4);
        iVar1 = *(int *)(local_1840 + lVar17 * 8 + 4);
        iVar15 = QGridBox::vStretch(pQVar6);
        distributeMultiBox(chain_00,iVar9,iVar14,iVar2,iVar1,&this->rStretch,iVar15);
      }
      iVar9 = pQVar6->col;
      iVar14 = this->cc + -1;
      if (-1 < pQVar6->tocol) {
        iVar14 = pQVar6->tocol;
      }
      if (iVar9 != iVar14) {
        iVar2 = *(int *)(local_1840 + lVar17 * 8 + -8);
        iVar1 = *(int *)(local_1840 + lVar17 * 8);
        iVar15 = QGridBox::hStretch(pQVar6);
        distributeMultiBox(chain,iVar9,iVar14,iVar2,iVar1,&this->cStretch,iVar15);
      }
      uVar18 = uVar18 + 1;
      lVar17 = lVar17 + 3;
    } while ((uVar19 & 0x7fffffff) != uVar18);
  }
  if (0 < this->rr) {
    lVar17 = 0x14;
    lVar20 = 0;
    do {
      pQVar7 = (this->rowData).d.ptr;
      bVar13 = true;
      if (*(char *)((long)&pQVar7->stretch + lVar17) == '\0') {
        bVar13 = 0 < *(int *)((long)pQVar7 + lVar17 + -0x14);
      }
      pQVar10 = QList<QLayoutStruct>::data(chain_00);
      *(bool *)((long)&pQVar10->stretch + lVar17) = bVar13;
      lVar20 = lVar20 + 1;
      lVar17 = lVar17 + 0x20;
    } while (lVar20 < this->rr);
  }
  if (0 < this->cc) {
    lVar17 = 0x14;
    lVar20 = 0;
    do {
      pQVar7 = (this->colData).d.ptr;
      bVar13 = true;
      if (*(char *)((long)&pQVar7->stretch + lVar17) == '\0') {
        bVar13 = 0 < *(int *)((long)pQVar7 + lVar17 + -0x14);
      }
      pQVar10 = QList<QLayoutStruct>::data(chain);
      *(bool *)((long)&pQVar10->stretch + lVar17) = bVar13;
      lVar20 = lVar20 + 1;
      lVar17 = lVar17 + 0x20;
    } while (lVar20 < this->cc);
  }
  QLayout::getContentsMargins
            (this_00,&this->leftMargin,&this->topMargin,&this->rightMargin,&this->bottomMargin);
  this->field_0x194 = this->field_0x194 & 0xfb;
  if (grid != local_2050) {
    QtPrivate::sizedFree(grid,local_2068 << 3);
  }
  if (local_1840 != local_1838) {
    QtPrivate::sizedFree(local_1840,local_1850 * 0x18);
  }
LAB_002e6067:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGridLayoutPrivate::setupLayoutData(int hSpacing, int vSpacing)
{
    Q_Q(QGridLayout);

#ifndef QT_LAYOUT_DISABLE_CACHING
    if (!needRecalc)
        return;
#endif
    has_hfw = false;
    int i;

    for (i = 0; i < rr; i++) {
        rowData[i].init(rStretch.at(i), rMinHeights.at(i));
        rowData[i].maximumSize = rStretch.at(i) ? QLAYOUTSIZE_MAX : rMinHeights.at(i);
    }
    for (i = 0; i < cc; i++) {
        colData[i].init(cStretch.at(i), cMinWidths.at(i));
        colData[i].maximumSize = cStretch.at(i) ? QLAYOUTSIZE_MAX : cMinWidths.at(i);
    }

    int n = things.size();
    QVarLengthArray<QGridLayoutSizeTriple> sizes(n);

    bool has_multi = false;

    /*
        Grid of items. We use it to determine which items are
        adjacent to which and compute the spacings correctly.
    */
    QVarLengthArray<QGridBox *> grid(rr * cc);
    memset(grid.data(), 0, rr * cc * sizeof(QGridBox *));

    /*
        Initialize 'sizes' and 'grid' data structures, and insert
        non-spanning items to our row and column data structures.
    */
    for (i = 0; i < n; ++i) {
        QGridBox * const box = things.at(i);
        sizes[i].minS = box->minimumSize();
        sizes[i].hint = box->sizeHint();
        sizes[i].maxS = box->maximumSize();

        if (box->hasHeightForWidth())
            has_hfw = true;

        if (box->row == box->toRow(rr)) {
            addData(box, sizes[i], true, false);
        } else {
            initEmptyMultiBox(rowData, box->row, box->toRow(rr));
            has_multi = true;
        }

        if (box->col == box->toCol(cc)) {
            addData(box, sizes[i], false, true);
        } else {
            initEmptyMultiBox(colData, box->col, box->toCol(cc));
            has_multi = true;
        }

        for (int r = box->row; r <= box->toRow(rr); ++r) {
            for (int c = box->col; c <= box->toCol(cc); ++c) {
                gridAt(grid.data(), r, c, cc) = box;
            }
        }
    }

    setupSpacings(colData, grid.data(), hSpacing, Qt::Horizontal);
    setupSpacings(rowData, grid.data(), vSpacing, Qt::Vertical);

    /*
        Insert multicell items to our row and column data structures.
        This must be done after the non-spanning items to obtain a
        better distribution in distributeMultiBox().
    */
    if (has_multi) {
        for (i = 0; i < n; ++i) {
            QGridBox * const box = things.at(i);

            if (box->row != box->toRow(rr))
                distributeMultiBox(rowData, box->row, box->toRow(rr), sizes[i].minS.height(),
                                   sizes[i].hint.height(), rStretch, box->vStretch());
            if (box->col != box->toCol(cc))
                distributeMultiBox(colData, box->col, box->toCol(cc), sizes[i].minS.width(),
                                   sizes[i].hint.width(), cStretch, box->hStretch());
        }
    }

    for (i = 0; i < rr; i++)
        rowData[i].expansive = rowData.at(i).expansive || rowData.at(i).stretch > 0;
    for (i = 0; i < cc; i++)
        colData[i].expansive = colData.at(i).expansive || colData.at(i).stretch > 0;

    q->getContentsMargins(&leftMargin, &topMargin, &rightMargin, &bottomMargin);

    needRecalc = false;
}